

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckingVisitor.cpp
# Opt level: O2

void __thiscall TypeCheckingVisitor::Visit(TypeCheckingVisitor *this,VariableExpression *expression)

{
  NewScopeLayer *pNVar1;
  bool bVar2;
  NewScopeLayer *this_00;
  mapped_type *pmVar3;
  string local_a0;
  Symbol local_80;
  Symbol local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)&expression->variable_name_);
  Symbol::Symbol(&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pNVar1 = this->current_layer_;
  while( true ) {
    this_00 = pNVar1;
    bVar2 = NewScopeLayer::HasArray(this_00,&local_60);
    if (bVar2) break;
    bVar2 = NewScopeLayer::HasVariable(this_00,&local_60);
    if ((bVar2) || (pNVar1 = this_00->parent_, this_00->parent_->parent_ == (NewScopeLayer *)0x0))
    break;
  }
  std::__cxx11::string::string((string *)&local_a0,(string *)&expression->variable_name_);
  Symbol::Symbol(&local_80,&local_a0);
  pmVar3 = std::__detail::
           _Map_base<Symbol,_std::pair<const_Symbol,_int>,_std::allocator<std::pair<const_Symbol,_int>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_int>,_std::allocator<std::pair<const_Symbol,_int>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this_00->symbol_types_,&local_80);
  (this->super_TemplateVisitor<int>).tos_value_ = *pmVar3;
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void TypeCheckingVisitor::Visit(VariableExpression* expression) {
  // can be arr or var
  const Symbol& symbol = Symbol(expression->variable_name_);
  NewScopeLayer* current = current_layer_;

  while (!current->HasArray(symbol) && !current->HasVariable(symbol) &&
         current->parent_->parent_ != nullptr) {
    current = current->parent_;
  }

  tos_value_ = current->symbol_types_[Symbol(expression->variable_name_)];
}